

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v5::print<char[100],std::__cxx11::string,std::__cxx11::string>
          (v5 *this,FILE *f,string_view format_str,char (*args) [100],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  string_view format_str_00;
  format_args args_00;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char[100],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  as;
  size_t local_38 [2];
  undefined8 local_28;
  undefined8 uStack_20;
  pointer local_18;
  size_type sStack_10;
  
  local_38[0] = format_str.size_;
  format_str_00.size_ = format_str.data_;
  local_28 = *(undefined8 *)*args;
  uStack_20 = *(undefined8 *)(*args + 8);
  local_18 = (args_1->_M_dataplus)._M_p;
  sStack_10 = args_1->_M_string_length;
  format_str_00.data_ = (char *)f;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_38;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = 0xbba;
  vprint((FILE *)this,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE *f, string_view format_str, const Args & ... args) {
  format_arg_store<format_context, Args...> as(args...);
  vprint(f, format_str, as);
}